

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O0

void Wlc_NtkAbsMarkNodes_rec
               (Wlc_Ntk_t *p,Wlc_Obj_t *pObj,Vec_Bit_t *vLeaves,Vec_Int_t *vPisOld,
               Vec_Int_t *vPisNew,Vec_Int_t *vFlops)

{
  int iVar1;
  Wlc_Obj_t *pObj_00;
  int local_3c;
  int iFanin;
  int i;
  Vec_Int_t *vFlops_local;
  Vec_Int_t *vPisNew_local;
  Vec_Int_t *vPisOld_local;
  Vec_Bit_t *vLeaves_local;
  Wlc_Obj_t *pObj_local;
  Wlc_Ntk_t *p_local;
  
  if ((*(ushort *)pObj >> 7 & 1) == 0) {
    *(ushort *)pObj = *(ushort *)pObj & 0xff7f | 0x80;
    iVar1 = Wlc_ObjId(p,pObj);
    iVar1 = Vec_BitEntry(vLeaves,iVar1);
    if (iVar1 == 0) {
      iVar1 = Wlc_ObjIsCi(pObj);
      if (iVar1 == 0) {
        for (local_3c = 0; iVar1 = Wlc_ObjFaninNum(pObj), local_3c < iVar1; local_3c = local_3c + 1)
        {
          iVar1 = Wlc_ObjFaninId(pObj,local_3c);
          pObj_00 = Wlc_NtkObj(p,iVar1);
          Wlc_NtkAbsMarkNodes_rec(p,pObj_00,vLeaves,vPisOld,vPisNew,vFlops);
        }
      }
      else {
        iVar1 = Wlc_ObjIsPi(pObj);
        if (iVar1 == 0) {
          iVar1 = Wlc_ObjId(p,pObj);
          Vec_IntPush(vFlops,iVar1);
        }
        else {
          iVar1 = Wlc_ObjId(p,pObj);
          Vec_IntPush(vPisOld,iVar1);
        }
      }
    }
    else {
      iVar1 = Wlc_ObjIsPi(pObj);
      if (iVar1 != 0) {
        __assert_fail("!Wlc_ObjIsPi(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcAbs2.c"
                      ,0x6d,
                      "void Wlc_NtkAbsMarkNodes_rec(Wlc_Ntk_t *, Wlc_Obj_t *, Vec_Bit_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      iVar1 = Wlc_ObjId(p,pObj);
      Vec_IntPush(vPisNew,iVar1);
    }
  }
  return;
}

Assistant:

static void Wlc_NtkAbsMarkNodes_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, Vec_Bit_t * vLeaves, Vec_Int_t * vPisOld, Vec_Int_t * vPisNew, Vec_Int_t * vFlops )
{
    int i, iFanin;
    if ( pObj->Mark )
        return;
    pObj->Mark = 1;
    if ( Vec_BitEntry(vLeaves, Wlc_ObjId(p, pObj)) )
    {
        assert( !Wlc_ObjIsPi(pObj) );
        Vec_IntPush( vPisNew, Wlc_ObjId(p, pObj) );
        return;
    }
    if ( Wlc_ObjIsCi(pObj) )
    {
        if ( Wlc_ObjIsPi(pObj) )
            Vec_IntPush( vPisOld, Wlc_ObjId(p, pObj) );
        else
            Vec_IntPush( vFlops, Wlc_ObjId(p, pObj) );
        return;
    }
    Wlc_ObjForEachFanin( pObj, iFanin, i )
        Wlc_NtkAbsMarkNodes_rec( p, Wlc_NtkObj(p, iFanin), vLeaves, vPisOld, vPisNew, vFlops );
}